

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASEParser.cpp
# Opt level: O3

void __thiscall Assimp::ASE::Parser::ParseLV2LightSettingsBlock(Parser *this,Light *light)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  ai_real *fOut;
  byte *pbVar6;
  byte *pbVar7;
  
  pbVar7 = (byte *)this->filePtr;
  iVar4 = 0;
  do {
    bVar1 = *pbVar7;
    pbVar6 = pbVar7;
    if (bVar1 == 0x2a) {
      do {
        pbVar7 = pbVar6 + 1;
        this->filePtr = (char *)pbVar7;
        iVar3 = strncmp("LIGHT_COLOR",(char *)pbVar7,0xb);
        if (iVar3 == 0) {
          bVar1 = pbVar6[0xc];
          if ((0x20 < (ulong)bVar1) || ((0x100003601U >> ((ulong)bVar1 & 0x3f) & 1) == 0))
          goto LAB_003e77e7;
          pbVar7 = pbVar6 + 0xd;
          if (bVar1 == 0) {
            pbVar7 = pbVar6 + 0xc;
          }
          this->filePtr = (char *)pbVar7;
          lVar5 = 0;
          do {
            ParseLV4MeshFloat(this,(ai_real *)((long)&(light->mColor).r + lVar5));
            lVar5 = lVar5 + 4;
          } while (lVar5 != 0xc);
        }
        else {
LAB_003e77e7:
          iVar3 = strncmp("LIGHT_INTENS",(char *)pbVar7,0xc);
          if (iVar3 == 0) {
            bVar1 = pbVar6[0xd];
            if ((0x20 < (ulong)bVar1) || ((0x100003601U >> ((ulong)bVar1 & 0x3f) & 1) == 0))
            goto LAB_003e7803;
            pbVar7 = pbVar6 + 0xd;
            lVar5 = 0xe;
            fOut = &light->mIntensity;
          }
          else {
LAB_003e7803:
            iVar3 = strncmp("LIGHT_HOTSPOT",(char *)pbVar7,0xd);
            if (iVar3 == 0) {
              bVar1 = pbVar6[0xe];
              if (((ulong)bVar1 < 0x21) && ((0x100003601U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) {
                pbVar7 = pbVar6 + 0xe;
                lVar5 = 0xf;
                fOut = &light->mAngle;
                goto LAB_003e7904;
              }
            }
            iVar3 = strncmp("LIGHT_FALLOFF",(char *)pbVar7,0xd);
            if (iVar3 != 0) break;
            bVar1 = pbVar6[0xe];
            if ((0x20 < (ulong)bVar1) || ((0x100003601U >> ((ulong)bVar1 & 0x3f) & 1) == 0)) break;
            pbVar7 = pbVar6 + 0xe;
            lVar5 = 0xf;
            fOut = &light->mFalloff;
          }
LAB_003e7904:
          pbVar6 = pbVar6 + lVar5;
          if (bVar1 == 0) {
            pbVar6 = pbVar7;
          }
          this->filePtr = (char *)pbVar6;
          ParseLV4MeshFloat(this,fOut);
        }
        pbVar7 = (byte *)this->filePtr;
        pbVar6 = pbVar7;
      } while (*pbVar7 == 0x2a);
      bVar1 = *pbVar7;
    }
    bVar2 = false;
    if (bVar1 < 0x7b) {
      if ((bVar1 - 0xc < 2) || (bVar1 == 10)) {
        if (this->bLastWasEndLine != false) goto LAB_003e797a;
        this->iLineNumber = this->iLineNumber + 1;
        bVar2 = true;
      }
      else if (bVar1 == 0) {
        LogError(this,"Encountered unexpected EOL while parsing a LIGHT_SETTINGS chunk (Level 2)");
      }
    }
    else {
      if (bVar1 == 0x7d) {
        iVar4 = iVar4 + -1;
        if (iVar4 == 0) {
          this->filePtr = (char *)(pbVar7 + 1);
          SkipToNextToken(this);
          return;
        }
      }
      else {
        if (bVar1 != 0x7b) goto LAB_003e797c;
        iVar4 = iVar4 + 1;
      }
LAB_003e797a:
      bVar2 = false;
    }
LAB_003e797c:
    this->bLastWasEndLine = bVar2;
    pbVar7 = pbVar7 + 1;
    this->filePtr = (char *)pbVar7;
  } while( true );
}

Assistant:

void Parser::ParseLV2LightSettingsBlock(ASE::Light& light)
{
    AI_ASE_PARSER_INIT();
    while (true)
    {
        if ('*' == *filePtr)
        {
            ++filePtr;
            if (TokenMatch(filePtr,"LIGHT_COLOR" ,11))
            {
                ParseLV4MeshFloatTriple(&light.mColor.r);
                continue;
            }
            if (TokenMatch(filePtr,"LIGHT_INTENS" ,12))
            {
                ParseLV4MeshFloat(light.mIntensity);
                continue;
            }
            if (TokenMatch(filePtr,"LIGHT_HOTSPOT" ,13))
            {
                ParseLV4MeshFloat(light.mAngle);
                continue;
            }
            if (TokenMatch(filePtr,"LIGHT_FALLOFF" ,13))
            {
                ParseLV4MeshFloat(light.mFalloff);
                continue;
            }
        }
        AI_ASE_HANDLE_SECTION("2","LIGHT_SETTINGS");
    }
    return;
}